

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true,_false>_>_>
::push_back(Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true,_false>_>_>
            *this,Entry *entry)

{
  node_ptr plVar1;
  undefined8 *puVar2;
  iterator local_8;
  
  plVar1 = (this->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  if ((plVar1 != (node_ptr)0x0) &&
     (local_8.members_.nodeptr_ =
           (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true,_false>_>::Matrix_column_tag,_1U>_*,_false>
            )&this->column_,
     (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true,_false>_>::Matrix_column_tag,_1U>_*,_false>
      )plVar1 != local_8.members_.nodeptr_)) {
    if (*(uint *)&(this->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_[1].
                  next_ < entry->rowIndex_) {
      _insert_entry(this,entry->rowIndex_,&local_8);
      return;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "The new row index has to be higher than the current pivot.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

inline void Intrusive_list_column<Master_matrix>::push_back(const Entry& entry)
{
  static_assert(Master_matrix::Option_list::is_of_boundary_type, "`push_back` is not available for Chain matrices.");

  GUDHI_CHECK(entry.get_row_index() > get_pivot(), "The new row index has to be higher than the current pivot.");

  if constexpr (Master_matrix::Option_list::is_z2) {
    _insert_entry(entry.get_row_index(), column_.end());
  } else {
    _insert_entry(entry.get_element(), entry.get_row_index(), column_.end());
  }
}